

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::ParseVector
          (Parser *this,Type *vector_type,uoffset_t *ovalue,FieldDef *field,size_t fieldn)

{
  undefined2 uVar1;
  FieldDef *pFVar2;
  anon_class_40_5_38b0cb7f body;
  bool bVar3;
  uint uVar4;
  uoffset_t uVar5;
  size_t sVar6;
  size_t sVar7;
  SymbolTable<flatbuffers::Value> *this_00;
  Value *pVVar8;
  char *pcVar9;
  reference ppFVar10;
  VectorOfAny *this_01;
  _anonymous_namespace_ *this_02;
  uint8_t *puVar11;
  Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *this_03;
  Offset<flatbuffers::Table> *pOVar12;
  Offset<flatbuffers::Table> *pOVar13;
  anon_class_16_2_e19d79f7 comparator;
  anon_class_8_1_6663148b swapper;
  Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *v_1;
  uint local_200;
  VectorOfAny *v;
  size_t struct_size;
  iterator iStack_1d8;
  voffset_t offset;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_1d0;
  iterator it;
  FieldDef *key;
  offset_type local_1b8;
  int elem_18;
  Offset<void> local_1b0;
  offset_type local_1ac;
  Offset<void> elem_17;
  Offset<void> local_1a4;
  offset_type_conflict oStack_1a0;
  Offset<void> elem_16;
  Offset64<void> local_190;
  Offset64<void> elem_15;
  Offset<void> local_17c;
  offset_type local_178;
  Offset<void> elem_14;
  Offset<void> local_170;
  byte local_169;
  Offset<void> elem_13;
  double elem_12;
  float local_158;
  byte local_151;
  float elem_11;
  uint64_t elem_10;
  long local_140;
  int64_t elem_9;
  uint local_130;
  byte local_129;
  uint32_t elem_8;
  byte local_121;
  int32_t elem_7;
  short local_11c;
  byte local_11a;
  uchar local_119;
  uint16_t elem_6;
  byte local_116;
  uchar local_115;
  int16_t elem_5;
  byte local_112;
  uint8_t elem_4;
  int8_t elem_3;
  uint8_t elem_2;
  uint8_t elem_1;
  reference pvStack_110;
  uint8_t elem;
  Value *val;
  size_t i;
  ulong local_f8;
  size_t align;
  string local_e8;
  Value *local_c8;
  Value *force_align;
  size_t elemsize;
  size_t len;
  size_t alignment;
  byte local_91;
  Type *local_90;
  Type *pTStack_88;
  size_t *local_80;
  uint16_t *puStack_78;
  size_t *local_70;
  undefined1 local_62 [8];
  CheckedError err;
  size_t count;
  Type type;
  size_t fieldn_local;
  FieldDef *field_local;
  uoffset_t *ovalue_local;
  Type *vector_type_local;
  Parser *this_local;
  CheckedError *ce;
  
  swapper.struct_size = (size_t)&count;
  fieldn_local = fieldn;
  field_local = field;
  ovalue_local = ovalue;
  vector_type_local = vector_type;
  this_local = this;
  Type::VectorType((Type *)swapper.struct_size,(Type *)ovalue);
  stack0xffffffffffffffa0 = (Value *)0x0;
  local_80 = &fieldn_local;
  puStack_78 = &type.fixed_length;
  local_70 = (size_t *)(local_62 + 2);
  body.this = (Parser *)vector_type;
  body.type = (Type *)swapper.struct_size;
  body.field = (FieldDef **)local_80;
  body.fieldn = (size_t *)puStack_78;
  body.count = local_70;
  local_90 = (Type *)swapper.struct_size;
  pTStack_88 = vector_type;
  ParseVectorDelimiters<flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__0>
            ((Parser *)local_62,(size_t *)vector_type,body);
  local_91 = 0;
  CheckedError::CheckedError((CheckedError *)this,(CheckedError *)local_62);
  bVar3 = CheckedError::Check((CheckedError *)this);
  if (bVar3) {
    local_91 = 1;
  }
  alignment._0_4_ = (uint)bVar3;
  if ((local_91 & 1) == 0) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  if ((uint)alignment == 0) {
    len = InlineAlignment((Type *)&count);
    pVVar8 = stack0xffffffffffffffa0;
    sVar6 = InlineSize((Type *)&count);
    sVar7 = InlineAlignment((Type *)&count);
    elemsize = ((long)pVVar8 * sVar6) / sVar7;
    force_align = (Value *)InlineAlignment((Type *)&count);
    this_00 = (SymbolTable<flatbuffers::Value> *)(fieldn_local + 0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"force_align",(allocator<char> *)((long)&align + 7));
    pVVar8 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&align + 7));
    local_c8 = pVVar8;
    if (pVVar8 != (Value *)0x0) {
      i._7_1_ = 0;
      ParseAlignAttribute(this,(string *)vector_type,(size_t)&pVVar8->constant,(size_t *)0x1);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        i._7_1_ = 1;
      }
      alignment._0_4_ = (uint)bVar3;
      if ((i._7_1_ & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if ((uint)alignment != 0) goto LAB_0011d29f;
      if (1 < local_f8) {
        FlatBufferBuilderImpl<false>::ForceVectorAlignment
                  ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,elemsize,
                   (size_t)force_align,local_f8);
      }
    }
    if (*ovalue_local == 0x12) {
      FlatBufferBuilderImpl<false>::StartVector<flatbuffers::Offset,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,elemsize,
                 (size_t)force_align,len);
    }
    else {
      FlatBufferBuilderImpl<false>::StartVector<flatbuffers::Offset,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,elemsize,
                 (size_t)force_align,len);
    }
    for (val = (Value *)0x0; val < stack0xffffffffffffffa0;
        val = (Value *)((long)&(val->type).base_type + 1)) {
      pvStack_110 = std::
                    vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                    ::back((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                            *)&vector_type[0x39].enum_def);
      switch((pvStack_110->first).type.base_type) {
      case BASE_TYPE_NONE:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          local_112 = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          anon_unknown_0::atot<unsigned_char>
                    ((anon_unknown_0 *)this,pcVar9,(Parser *)vector_type,&elem_4);
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            local_112 = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if ((local_112 & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,elem_4);
        }
        break;
      case BASE_TYPE_UTYPE:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          elem_5._0_1_ = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          anon_unknown_0::atot<unsigned_char>
                    ((anon_unknown_0 *)this,pcVar9,(Parser *)vector_type,
                     (uchar *)((long)&elem_5 + 1));
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            elem_5._0_1_ = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if (((byte)elem_5 & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,elem_5._1_1_);
        }
        break;
      case BASE_TYPE_BOOL:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          local_116 = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          anon_unknown_0::atot<unsigned_char>
                    ((anon_unknown_0 *)this,pcVar9,(Parser *)vector_type,&local_115);
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            local_116 = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if ((local_116 & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,local_115);
        }
        break;
      case BASE_TYPE_CHAR:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          elem_6._0_1_ = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          anon_unknown_0::atot<signed_char>
                    ((anon_unknown_0 *)this,pcVar9,(Parser *)vector_type,(char *)((long)&elem_6 + 1)
                    );
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            elem_6._0_1_ = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if (((byte)elem_6 & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,elem_6._1_1_);
        }
        break;
      case BASE_TYPE_UCHAR:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          local_11a = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          anon_unknown_0::atot<unsigned_char>
                    ((anon_unknown_0 *)this,pcVar9,(Parser *)vector_type,&local_119);
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            local_11a = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if ((local_11a & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,local_119);
        }
        break;
      case BASE_TYPE_SHORT:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          elem_7._3_1_ = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          anon_unknown_0::atot<short>
                    ((anon_unknown_0 *)this,pcVar9,(Parser *)vector_type,&local_11c);
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            elem_7._3_1_ = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if ((elem_7._3_1_ & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,local_11c);
        }
        break;
      case BASE_TYPE_USHORT:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          local_121 = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          anon_unknown_0::atot<unsigned_short>
                    ((anon_unknown_0 *)this,pcVar9,(Parser *)vector_type,(unsigned_short *)&elem_7);
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            local_121 = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if ((local_121 & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          FlatBufferBuilderImpl<false>::PushElement<unsigned_short,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,
                     (unsigned_short)elem_7);
        }
        break;
      case BASE_TYPE_INT:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          local_129 = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          anon_unknown_0::atot<int>
                    ((anon_unknown_0 *)this,pcVar9,(Parser *)vector_type,(int *)&elem_8);
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            local_129 = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if ((local_129 & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,elem_8);
        }
        break;
      case BASE_TYPE_UINT:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          elem_9._7_1_ = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          anon_unknown_0::atot<unsigned_int>
                    ((anon_unknown_0 *)this,pcVar9,(Parser *)vector_type,&local_130);
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            elem_9._7_1_ = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if ((elem_9._7_1_ & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,local_130);
        }
        break;
      case BASE_TYPE_LONG:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          elem_10._7_1_ = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          anon_unknown_0::atot<long>((anon_unknown_0 *)this,pcVar9,(Parser *)vector_type,&local_140)
          ;
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            elem_10._7_1_ = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if ((elem_10._7_1_ & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          FlatBufferBuilderImpl<false>::PushElement<long,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,local_140);
        }
        break;
      case BASE_TYPE_ULONG:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          local_151 = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          anon_unknown_0::atot<unsigned_long>
                    ((anon_unknown_0 *)this,pcVar9,(Parser *)vector_type,(unsigned_long *)&elem_11);
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            local_151 = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if ((local_151 & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,_elem_11);
        }
        break;
      case BASE_TYPE_FLOAT:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          pcVar9 = (char *)std::__cxx11::string::c_str();
          anon_unknown_0::atot<float>
                    ((anon_unknown_0 *)this,pcVar9,(Parser *)vector_type,&local_158);
          bVar3 = CheckedError::Check((CheckedError *)this);
          alignment._0_4_ = (uint)bVar3;
          if (!bVar3) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          FlatBufferBuilderImpl<false>::PushElement<float,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,local_158);
        }
        break;
      case BASE_TYPE_DOUBLE:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          local_169 = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          anon_unknown_0::atot<double>
                    ((anon_unknown_0 *)this,pcVar9,(Parser *)vector_type,(double *)&elem_13);
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            local_169 = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if ((local_169 & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          FlatBufferBuilderImpl<false>::PushElement<double,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,_elem_13);
        }
        break;
      case BASE_TYPE_STRING:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          Offset<void>::Offset(&local_170);
          elem_14.o._3_1_ = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          (anonymous_namespace)::atot<flatbuffers::Offset<void>>
                    ((_anonymous_namespace_ *)this,pcVar9,(Parser *)vector_type,&local_170);
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            elem_14.o._3_1_ = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if ((elem_14.o._3_1_ & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          local_178 = local_170.o;
          FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,local_170);
        }
        break;
      case BASE_TYPE_VECTOR:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          Offset<void>::Offset(&local_17c);
          pcVar9 = (char *)std::__cxx11::string::c_str();
          (anonymous_namespace)::atot<flatbuffers::Offset<void>>
                    ((_anonymous_namespace_ *)this,pcVar9,(Parser *)vector_type,&local_17c);
          bVar3 = CheckedError::Check((CheckedError *)this);
          alignment._0_4_ = (uint)bVar3;
          if (!bVar3) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          elem_15.o._4_4_ = local_17c.o;
          FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,local_17c);
        }
        break;
      case BASE_TYPE_STRUCT:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          Offset<void>::Offset(&local_1a4);
          elem_17.o._3_1_ = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          (anonymous_namespace)::atot<flatbuffers::Offset<void>>
                    ((_anonymous_namespace_ *)this,pcVar9,(Parser *)vector_type,&local_1a4);
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            elem_17.o._3_1_ = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if ((elem_17.o._3_1_ & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          local_1ac = local_1a4.o;
          FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,local_1a4);
        }
        break;
      case BASE_TYPE_UNION:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          Offset<void>::Offset(&local_1b0);
          elem_18._3_1_ = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          (anonymous_namespace)::atot<flatbuffers::Offset<void>>
                    ((_anonymous_namespace_ *)this,pcVar9,(Parser *)vector_type,&local_1b0);
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            elem_18._3_1_ = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if ((elem_18._3_1_ & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          local_1b8 = local_1b0.o;
          FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,local_1b0);
        }
        break;
      case BASE_TYPE_ARRAY:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          key._3_1_ = 0;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          anon_unknown_0::atot<int>
                    ((anon_unknown_0 *)this,pcVar9,(Parser *)vector_type,(int *)((long)&key + 4));
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) {
            key._3_1_ = 1;
          }
          alignment._0_4_ = (uint)bVar3;
          if ((key._3_1_ & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,key._4_4_);
        }
        break;
      case BASE_TYPE_VECTOR64:
        bVar3 = IsStruct((Type *)pvStack_110);
        if (bVar3) {
          SerializeStruct((Parser *)vector_type,(pvStack_110->first).type.struct_def,
                          &pvStack_110->first);
        }
        else {
          Offset64<void>::Offset64(&local_190);
          pcVar9 = (char *)std::__cxx11::string::c_str();
          (anonymous_namespace)::atot<flatbuffers::Offset64<void>>
                    ((_anonymous_namespace_ *)this,pcVar9,(Parser *)vector_type,&local_190);
          bVar3 = CheckedError::Check((CheckedError *)this);
          alignment._0_4_ = (uint)bVar3;
          if (!bVar3) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((uint)alignment != 0) goto LAB_0011d29f;
          oStack_1a0 = local_190.o;
          FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset64>
                    ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,local_190);
        }
      }
      std::
      vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
      ::pop_back((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                  *)&vector_type[0x39].enum_def);
    }
    FlatBufferBuilderImpl<false>::ClearOffsets
              ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def);
    if (*ovalue_local == 0x12) {
      uVar4 = FlatBufferBuilderImpl<false>::EndVector<unsigned_long,unsigned_int>
                        ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,
                         (size_t)stack0xffffffffffffffa0);
      *(uint *)&(field_local->super_Definition).name = uVar4;
    }
    else {
      uVar4 = FlatBufferBuilderImpl<false>::EndVector<unsigned_int,unsigned_int>
                        ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,
                         (size_t)stack0xffffffffffffffa0);
      *(uint *)&(field_local->super_Definition).name = uVar4;
    }
    if (((int)count == 0xf) && ((*(byte *)(type._0_8_ + 0x113) & 1) != 0)) {
      it._M_current = (FieldDef **)0x0;
      local_1d0._M_current =
           (FieldDef **)
           std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                      (type._0_8_ + 0xf8));
      while( true ) {
        iStack_1d8 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ::end((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                            *)(type._0_8_ + 0xf8));
        bVar3 = __gnu_cxx::operator!=(&local_1d0,&stack0xfffffffffffffe28);
        if (!bVar3) break;
        ppFVar10 = __gnu_cxx::
                   __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                   ::operator*(&local_1d0);
        if (((*ppFVar10)->key & 1U) != 0) {
          ppFVar10 = __gnu_cxx::
                     __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                     ::operator*(&local_1d0);
          it._M_current = (FieldDef **)*ppFVar10;
          break;
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
        ::operator++(&local_1d0);
      }
      if (it._M_current == (FieldDef **)0x0) {
        __assert_fail("key",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                      ,0x6ea,
                      "CheckedError flatbuffers::Parser::ParseVector(const Type &, uoffset_t *, FieldDef *, size_t)"
                     );
      }
      if ((*(byte *)(type._0_8_ + 0x110) & 1) == 0) {
        this_03 = (Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *)
                  FlatBufferBuilderImpl<false>::GetCurrentBufferPointer
                            ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def);
        if (*(int *)(it._M_current + 0x19) == 0xd) {
          pOVar12 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::data(this_03);
          pOVar13 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::data(this_03);
          uVar4 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::size(this_03);
          (anonymous_namespace)::
          SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__3,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
                    (pOVar12,pOVar13 + uVar4,1,(anon_class_8_1_ba1d59bf)it._M_current,
                     anon_unknown_0::SwapSerializedTables);
        }
        else {
          pOVar12 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::data(this_03);
          pOVar13 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::data(this_03);
          uVar4 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::size(this_03);
          (anonymous_namespace)::
          SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__4,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
                    (pOVar12,pOVar13 + uVar4,1,(anon_class_8_1_ba1d59bf)it._M_current,
                     anon_unknown_0::SwapSerializedTables);
        }
      }
      else {
        uVar1 = *(undefined2 *)(it._M_current + 0x21);
        pFVar2 = *(FieldDef **)(type._0_8_ + 0x120);
        this_01 = (VectorOfAny *)
                  FlatBufferBuilderImpl<false>::GetCurrentBufferPointer
                            ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def);
        this_02 = (_anonymous_namespace_ *)VectorOfAny::Data(this_01);
        puVar11 = VectorOfAny::Data(this_01);
        uVar5 = VectorOfAny::size(this_01);
        local_200 = CONCAT22(local_200._2_2_,uVar1);
        comparator.key = pFVar2;
        comparator._0_8_ = it._M_current;
        (anonymous_namespace)::
        SimpleQsort<unsigned_char,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__1,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__2>
                  (this_02,puVar11 + (ulong)uVar5 * (long)*(uchar **)(type._0_8_ + 0x120),
                   *(uchar **)(type._0_8_ + 0x120),(ulong)local_200,comparator,swapper);
      }
    }
    anon_unknown_0::NoError();
    alignment._0_4_ = 1;
  }
LAB_0011d29f:
  CheckedError::~CheckedError((CheckedError *)local_62);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseVector(const Type &vector_type, uoffset_t *ovalue,
                                 FieldDef *field, size_t fieldn) {
  Type type = vector_type.VectorType();
  size_t count = 0;
  auto err = ParseVectorDelimiters(count, [&](size_t &) -> CheckedError {
    Value val;
    val.type = type;
    ECHECK(ParseAnyValue(val, field, fieldn, nullptr, count, true));
    field_stack_.push_back(std::make_pair(val, nullptr));
    return NoError();
  });
  ECHECK(err);

  const size_t alignment = InlineAlignment(type);
  const size_t len = count * InlineSize(type) / InlineAlignment(type);
  const size_t elemsize = InlineAlignment(type);
  const auto force_align = field->attributes.Lookup("force_align");
  if (force_align) {
    size_t align;
    ECHECK(ParseAlignAttribute(force_align->constant, 1, &align));
    if (align > 1) { builder_.ForceVectorAlignment(len, elemsize, align); }
  }

  // TODO Fix using element alignment as size (`elemsize`)!
  if (vector_type.base_type == BASE_TYPE_VECTOR64) {
    // TODO(derekbailey): this requires a 64-bit builder.
    // builder_.StartVector<Offset64, uoffset64_t>(len, elemsize, alignment);
    builder_.StartVector(len, elemsize, alignment);
  } else {
    builder_.StartVector(len, elemsize, alignment);
  }
  for (size_t i = 0; i < count; i++) {
    // start at the back, since we're building the data backwards.
    auto &val = field_stack_.back().first;
    switch (val.type.base_type) {
      // clang-format off
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE,...) \
        case BASE_TYPE_ ## ENUM: \
          if (IsStruct(val.type)) SerializeStruct(*val.type.struct_def, val); \
          else { \
             CTYPE elem; \
             ECHECK(atot(val.constant.c_str(), *this, &elem)); \
             builder_.PushElement(elem); \
          } \
          break;
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
      // clang-format on
    }
    field_stack_.pop_back();
  }

  builder_.ClearOffsets();
  if (vector_type.base_type == BASE_TYPE_VECTOR64) {
    *ovalue = builder_.EndVector<uoffset64_t>(count);
  } else {
    *ovalue = builder_.EndVector(count);
  }

  if (type.base_type == BASE_TYPE_STRUCT && type.struct_def->has_key) {
    // We should sort this vector. Find the key first.
    const FieldDef *key = nullptr;
    for (auto it = type.struct_def->fields.vec.begin();
         it != type.struct_def->fields.vec.end(); ++it) {
      if ((*it)->key) {
        key = (*it);
        break;
      }
    }
    FLATBUFFERS_ASSERT(key);
    // Now sort it.
    // We can't use std::sort because for structs the size is not known at
    // compile time, and for tables our iterators dereference offsets, so can't
    // be used to swap elements.
    // And we can't use C qsort either, since that would force use to use
    // globals, making parsing thread-unsafe.
    // So for now, we use SimpleQsort above.
    // TODO: replace with something better, preferably not recursive.

    if (type.struct_def->fixed) {
      const voffset_t offset = key->value.offset;
      const size_t struct_size = type.struct_def->bytesize;
      auto v =
          reinterpret_cast<VectorOfAny *>(builder_.GetCurrentBufferPointer());
      SimpleQsort<uint8_t>(
          v->Data(), v->Data() + v->size() * type.struct_def->bytesize,
          type.struct_def->bytesize,
          [offset, key](const uint8_t *a, const uint8_t *b) -> bool {
            return CompareSerializedScalars(a + offset, b + offset, *key);
          },
          [struct_size](uint8_t *a, uint8_t *b) {
            // FIXME: faster?
            for (size_t i = 0; i < struct_size; i++) { std::swap(a[i], b[i]); }
          });
    } else {
      auto v = reinterpret_cast<Vector<Offset<Table>> *>(
          builder_.GetCurrentBufferPointer());
      // Here also can't use std::sort. We do have an iterator type for it,
      // but it is non-standard as it will dereference the offsets, and thus
      // can't be used to swap elements.
      if (key->value.type.base_type == BASE_TYPE_STRING) {
        SimpleQsort<Offset<Table>>(
            v->data(), v->data() + v->size(), 1,
            [key](const Offset<Table> *_a, const Offset<Table> *_b) -> bool {
              return CompareTablesByStringKey(_a, _b, *key);
            },
            SwapSerializedTables);
      } else {
        SimpleQsort<Offset<Table>>(
            v->data(), v->data() + v->size(), 1,
            [key](const Offset<Table> *_a, const Offset<Table> *_b) -> bool {
              return CompareTablesByScalarKey(_a, _b, *key);
            },
            SwapSerializedTables);
      }
    }
  }
  return NoError();
}